

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Unmap(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  Vec_Int_t *pVVar5;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"vh"), iVar3 == 0x76) {
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (iVar3 != -1) {
    Abc_Print(-2,"usage: &unmap [-vh]\n");
    Abc_Print(-2,"\t           removes mapping from the current network\n");
    pcVar4 = "yes";
    if (!bVar2) {
      pcVar4 = "no";
    }
    Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar4);
    pcVar4 = "\t-h       : print the command usage\n";
    iVar3 = -2;
LAB_00287757:
    Abc_Print(iVar3,pcVar4);
    return 1;
  }
  pGVar1 = pAbc->pGia;
  if (pGVar1 == (Gia_Man_t *)0x0) {
    pcVar4 = "Abc_CommandAbc9Struct(): There is no AIG to map.\n";
    iVar3 = -1;
    goto LAB_00287757;
  }
  pVVar5 = pGVar1->vMapping;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pGVar1->vMapping->pArray = (int *)0x0;
      pVVar5 = pGVar1->vMapping;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_002875a7;
    }
    free(pVVar5);
    pGVar1->vMapping = (Vec_Int_t *)0x0;
  }
LAB_002875a7:
  pGVar1 = pAbc->pGia;
  pVVar5 = pGVar1->vPacking;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pGVar1->vPacking->pArray = (int *)0x0;
      pVVar5 = pGVar1->vPacking;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_002875f6;
    }
    free(pVVar5);
    pGVar1->vPacking = (Vec_Int_t *)0x0;
  }
LAB_002875f6:
  pGVar1 = pAbc->pGia;
  pVVar5 = pGVar1->vCellMapping;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pGVar1->vCellMapping->pArray = (int *)0x0;
      pVVar5 = pGVar1->vCellMapping;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00287645;
    }
    free(pVVar5);
    pGVar1->vCellMapping = (Vec_Int_t *)0x0;
  }
LAB_00287645:
  pGVar1 = pAbc->pGia;
  pVVar5 = pGVar1->vEdge1;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pGVar1->vEdge1->pArray = (int *)0x0;
      pVVar5 = pGVar1->vEdge1;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00287694;
    }
    free(pVVar5);
    pGVar1->vEdge1 = (Vec_Int_t *)0x0;
  }
LAB_00287694:
  pGVar1 = pAbc->pGia;
  pVVar5 = pGVar1->vEdge2;
  if (pVVar5 == (Vec_Int_t *)0x0) {
    return 0;
  }
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pGVar1->vEdge2->pArray = (int *)0x0;
    pVVar5 = pGVar1->vEdge2;
    if (pVVar5 == (Vec_Int_t *)0x0) {
      return 0;
    }
  }
  free(pVVar5);
  pGVar1->vEdge2 = (Vec_Int_t *)0x0;
  return 0;
}

Assistant:

int Abc_CommandAbc9Unmap( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManTestStruct( Gia_Man_t * p );
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Struct(): There is no AIG to map.\n" );
        return 1;
    }
    Vec_IntFreeP( &pAbc->pGia->vMapping );
    Vec_IntFreeP( &pAbc->pGia->vPacking );
    Vec_IntFreeP( &pAbc->pGia->vCellMapping );
    Vec_IntFreeP( &pAbc->pGia->vEdge1 );
    Vec_IntFreeP( &pAbc->pGia->vEdge2 );
    return 0;

usage:
    Abc_Print( -2, "usage: &unmap [-vh]\n" );
    Abc_Print( -2, "\t           removes mapping from the current network\n" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}